

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O0

void wabt::RenameToIdentifiers<wabt::Export>
               (vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *things,BindingHash *bh,
               set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *filter)

{
  bool bVar1;
  reference ppEVar2;
  Export *thing;
  iterator __end0;
  iterator __begin0;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *__range2;
  Index i;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *filter_local;
  BindingHash *bh_local;
  vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *things_local;
  
  __range2._4_4_ = 0;
  __end0 = std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::begin(things);
  thing = (Export *)std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>::end(things);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<wabt::Export_**,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                                *)&thing);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<wabt::Export_**,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
              ::operator*(&__end0);
    RenameToIdentifier(&(*ppEVar2)->name,__range2._4_4_,bh,filter);
    __gnu_cxx::
    __normal_iterator<wabt::Export_**,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
    ::operator++(&__end0);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  return;
}

Assistant:

void RenameToIdentifiers(std::vector<T*>& things,
                         BindingHash& bh,
                         const std::set<std::string_view>* filter) {
  Index i = 0;
  for (auto thing : things) {
    RenameToIdentifier(thing->name, i++, bh, filter);
  }
}